

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collections.hpp
# Opt level: O0

Oop __thiscall Lodtalk::MethodDictionary::internalAtOrNil(MethodDictionary *this,Oop key)

{
  bool bVar1;
  ptrdiff_t pVar2;
  Oop *pOVar3;
  Oop oldKey;
  ptrdiff_t position;
  MethodDictionary *this_local;
  Oop key_local;
  
  pVar2 = HashedCollection::
          findKeyPosition<Lodtalk::Oop(Lodtalk::Oop_const&),int(Lodtalk::Oop),bool(Lodtalk::Oop,Lodtalk::Oop)>
                    ((HashedCollection *)this,key,identityFunction<Lodtalk::Oop>,identityHashOf,
                     identityOopEquals);
  if (pVar2 < 0) {
    key_local = nilOop();
  }
  else {
    pOVar3 = getHashTableKeys(this);
    bVar1 = isNil((Oop)pOVar3[pVar2].field_0);
    if (bVar1) {
      key_local = nilOop();
    }
    else {
      pOVar3 = getHashTableValues(this);
      key_local.field_0 = pOVar3[pVar2].field_0;
    }
  }
  return (Oop)key_local.field_0.pointer;
}

Assistant:

Oop internalAtOrNil(Oop key)
	{
		// If a slot was not found, try to increase the capacity.
		auto position = findKeyPosition(key, identityFunction<Oop>, identityHashOf, identityOopEquals);
		if(position < 0)
			return nilOop();

		auto oldKey = getHashTableKeys()[position];
		if(isNil(oldKey))
			return nilOop();
		return getHashTableValues()[position];
	}